

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

int ncnn::reduction_op_keepdims<std::plus<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  Allocator *pAVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  void *pvVar11;
  long lVar12;
  void *pvVar13;
  uint uVar14;
  int *piVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  void *pvVar19;
  ulong uVar20;
  bool bVar21;
  ulong uVar22;
  ulong uVar23;
  float fVar24;
  void *ptr;
  Mat local_78;
  
  sVar2 = a->elemsize;
  iVar1 = a->dims;
  if (iVar1 == 3) {
    uVar10 = a->w;
    uVar20 = (ulong)uVar10;
    uVar8 = a->h;
    uVar18 = (ulong)uVar8;
    iVar1 = a->c;
    lVar12 = (long)iVar1;
    uVar14 = uVar8 * uVar10;
    bVar21 = !reduce_w;
    bVar7 = !reduce_h;
    if ((bVar21 || bVar7) || !reduce_c) {
      if ((!bVar21 && !bVar7) && !reduce_c) {
        Mat::create(b,1,1,iVar1,sVar2,opt->blob_allocator);
        if (0 < iVar1) {
          pvVar11 = a->data;
          sVar2 = a->cstep;
          pvVar13 = b->data;
          sVar3 = b->cstep;
          sVar4 = b->elemsize;
          sVar5 = a->elemsize;
          lVar16 = 0;
          do {
            fVar24 = 0.0;
            if (0 < (int)uVar14) {
              uVar20 = 0;
              do {
                fVar24 = fVar24 + *(float *)((long)pvVar11 + uVar20 * 4);
                uVar20 = uVar20 + 1;
              } while (uVar14 != uVar20);
            }
            *(float *)((long)pvVar13 + sVar3 * sVar4 * lVar16) = fVar24;
            lVar16 = lVar16 + 1;
            pvVar11 = (void *)((long)pvVar11 + sVar2 * sVar5);
          } while (lVar16 != lVar12);
          return 0;
        }
        return 0;
      }
      lVar16 = (long)(int)uVar10;
      if ((!bVar21 && !reduce_h) && !reduce_c) {
        Mat::create(b,1,uVar8,iVar1,sVar2,opt->blob_allocator);
        if (0 < iVar1) {
          pvVar11 = a->data;
          sVar2 = a->cstep;
          sVar3 = b->cstep;
          sVar4 = b->elemsize;
          sVar5 = a->elemsize;
          pvVar13 = b->data;
          lVar17 = 0;
          do {
            if (0 < (int)uVar8) {
              uVar22 = 0;
              pvVar19 = pvVar11;
              do {
                fVar24 = 0.0;
                if (0 < (int)uVar10) {
                  uVar23 = 0;
                  do {
                    fVar24 = fVar24 + *(float *)((long)pvVar19 + uVar23 * 4);
                    uVar23 = uVar23 + 1;
                  } while (uVar20 != uVar23);
                }
                *(float *)((long)pvVar13 + uVar22 * 4 + sVar3 * sVar4 * lVar17) = fVar24;
                uVar22 = uVar22 + 1;
                pvVar19 = (void *)((long)pvVar19 + lVar16 * 4);
              } while (uVar22 != uVar18);
            }
            lVar17 = lVar17 + 1;
            pvVar11 = (void *)((long)pvVar11 + sVar2 * sVar5);
          } while (lVar17 != lVar12);
          return 0;
        }
        return 0;
      }
      if ((!bVar21 && !reduce_h) && reduce_c) {
        Mat::create(b,1,uVar8,1,sVar2,opt->blob_allocator);
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.c = 0;
        local_78.cstep = 0;
        Mat::create(&local_78,1,uVar8,iVar1,sVar2,opt->workspace_allocator);
        pvVar11 = local_78.data;
        iVar9 = -100;
        if ((local_78.data == (void *)0x0) || (local_78.cstep * (long)local_78.c == 0))
        goto LAB_00140ebd;
        uVar14 = (int)local_78.cstep * local_78.c;
        if (0 < (int)uVar14) {
          memset(local_78.data,0,(ulong)uVar14 << 2);
        }
        if (0 < iVar1) {
          sVar2 = a->cstep;
          sVar3 = a->elemsize;
          pvVar13 = a->data;
          lVar17 = 0;
          do {
            if (0 < (int)uVar8) {
              uVar22 = 0;
              pvVar19 = pvVar13;
              do {
                fVar24 = 0.0;
                if (0 < (int)uVar10) {
                  uVar23 = 0;
                  do {
                    fVar24 = fVar24 + *(float *)((long)pvVar19 + uVar23 * 4);
                    uVar23 = uVar23 + 1;
                  } while (uVar20 != uVar23);
                }
                *(float *)((long)pvVar11 +
                          uVar22 * 4 +
                          local_78.cstep *
                          CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) * lVar17)
                     = fVar24;
                uVar22 = uVar22 + 1;
                pvVar19 = (void *)((long)pvVar19 + lVar16 * 4);
              } while (uVar22 != uVar18);
            }
            lVar17 = lVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
          } while (lVar17 != lVar12);
        }
        uVar10 = b->c * (int)b->cstep;
        if (0 < (int)uVar10) {
          memset(b->data,0,(ulong)uVar10 << 2);
        }
        if (0 < iVar1) {
          pvVar11 = b->data;
          lVar16 = 0;
          pvVar13 = local_78.data;
          do {
            if (0 < (int)uVar8) {
              uVar20 = 0;
              do {
                *(float *)((long)pvVar11 + uVar20 * 4) =
                     *(float *)((long)pvVar13 + uVar20 * 4) + *(float *)((long)pvVar11 + uVar20 * 4)
                ;
                uVar20 = uVar20 + 1;
              } while (uVar18 != uVar20);
            }
            lVar16 = lVar16 + 1;
            pvVar13 = (void *)((long)pvVar13 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (lVar16 != lVar12);
        }
      }
      else {
        if ((bVar7 || reduce_w) || !reduce_c) {
          if ((!reduce_w && !reduce_h) && reduce_c) {
            Mat::create(b,uVar10,uVar8,1,sVar2,opt->blob_allocator);
            uVar10 = b->c * (int)b->cstep;
            if (0 < (int)uVar10) {
              memset(b->data,0,(ulong)uVar10 << 2);
            }
            if (0 < iVar1) {
              sVar2 = a->cstep;
              sVar3 = a->elemsize;
              pvVar11 = a->data;
              pvVar13 = b->data;
              lVar16 = 0;
              do {
                if (0 < (int)uVar14) {
                  uVar20 = 0;
                  do {
                    *(float *)((long)pvVar13 + uVar20 * 4) =
                         *(float *)((long)pvVar11 + uVar20 * 4) +
                         *(float *)((long)pvVar13 + uVar20 * 4);
                    uVar20 = uVar20 + 1;
                  } while (uVar14 != uVar20);
                }
                lVar16 = lVar16 + 1;
                pvVar11 = (void *)((long)pvVar11 + sVar2 * sVar3);
              } while (lVar16 != lVar12);
              return 0;
            }
            return 0;
          }
          if ((bVar7 || reduce_w) || reduce_c) {
            return 0;
          }
          Mat::create(b,uVar10,1,iVar1,sVar2,opt->blob_allocator);
          sVar2 = b->cstep;
          uVar14 = b->c * (int)sVar2;
          if (0 < (int)uVar14) {
            memset(b->data,0,(ulong)uVar14 << 2);
          }
          if (0 < iVar1) {
            pvVar11 = a->data;
            sVar3 = a->cstep;
            pvVar13 = b->data;
            sVar4 = a->elemsize;
            sVar5 = b->elemsize;
            lVar17 = 0;
            do {
              if (0 < (int)uVar8) {
                uVar14 = 0;
                pvVar19 = pvVar11;
                do {
                  if (0 < (int)uVar10) {
                    uVar18 = 0;
                    do {
                      *(float *)((long)pvVar13 + uVar18 * 4) =
                           *(float *)((long)pvVar19 + uVar18 * 4) +
                           *(float *)((long)pvVar13 + uVar18 * 4);
                      uVar18 = uVar18 + 1;
                    } while (uVar20 != uVar18);
                  }
                  uVar14 = uVar14 + 1;
                  pvVar19 = (void *)((long)pvVar19 + lVar16 * 4);
                } while (uVar14 != uVar8);
              }
              lVar17 = lVar17 + 1;
              pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar4);
              pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar5);
            } while (lVar17 != lVar12);
            return 0;
          }
          return 0;
        }
        Mat::create(b,uVar10,1,1,sVar2,opt->blob_allocator);
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.c = 0;
        local_78.cstep = 0;
        Mat::create(&local_78,uVar10,1,iVar1,sVar2,opt->workspace_allocator);
        pvVar11 = local_78.data;
        iVar9 = -100;
        if ((local_78.data == (void *)0x0) || (local_78.cstep * (long)local_78.c == 0))
        goto LAB_00140ebd;
        uVar14 = (int)local_78.cstep * local_78.c;
        if (0 < (int)uVar14) {
          memset(local_78.data,0,(ulong)uVar14 << 2);
        }
        if (0 < iVar1) {
          pvVar13 = a->data;
          sVar2 = a->cstep;
          sVar3 = a->elemsize;
          lVar17 = 0;
          do {
            if (0 < (int)uVar8) {
              uVar14 = 0;
              pvVar19 = pvVar13;
              do {
                if (0 < (int)uVar10) {
                  uVar18 = 0;
                  do {
                    *(float *)((long)pvVar11 + uVar18 * 4) =
                         *(float *)((long)pvVar19 + uVar18 * 4) +
                         *(float *)((long)pvVar11 + uVar18 * 4);
                    uVar18 = uVar18 + 1;
                  } while (uVar20 != uVar18);
                }
                uVar14 = uVar14 + 1;
                pvVar19 = (void *)((long)pvVar19 + lVar16 * 4);
              } while (uVar14 != uVar8);
            }
            lVar17 = lVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
            pvVar11 = (void *)((long)pvVar11 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (lVar17 != lVar12);
        }
        uVar8 = b->c * (int)b->cstep;
        if (0 < (int)uVar8) {
          memset(b->data,0,(ulong)uVar8 << 2);
        }
        if (0 < iVar1) {
          pvVar11 = b->data;
          lVar16 = 0;
          pvVar13 = local_78.data;
          do {
            if (0 < (int)uVar10) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar11 + uVar18 * 4) =
                     *(float *)((long)pvVar13 + uVar18 * 4) + *(float *)((long)pvVar11 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar20 != uVar18);
            }
            lVar16 = lVar16 + 1;
            pvVar13 = (void *)((long)pvVar13 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (lVar16 != lVar12);
        }
      }
      iVar9 = 0;
LAB_00140ebd:
      Mat::~Mat(&local_78);
      return iVar9;
    }
    Mat::create(b,1,1,1,sVar2,opt->blob_allocator);
    if (iVar1 == 0) {
      return -100;
    }
    pAVar6 = opt->workspace_allocator;
    uVar20 = sVar2 * lVar12 + 3 & 0xfffffffffffffffc;
    if (pAVar6 == (Allocator *)0x0) {
      local_78.data = (void *)0x0;
      iVar9 = posix_memalign(&local_78.data,0x10,uVar20 + 4);
      pvVar11 = (void *)0x0;
      if (iVar9 == 0) {
        pvVar11 = local_78.data;
      }
    }
    else {
      pvVar11 = (void *)(**(code **)(*(long *)pAVar6 + 0x10))();
    }
    *(undefined4 *)((long)pvVar11 + uVar20) = 1;
    if (iVar1 < 1) {
LAB_00140b64:
      fVar24 = 0.0;
    }
    else {
      pvVar13 = a->data;
      sVar2 = a->cstep;
      sVar3 = a->elemsize;
      lVar16 = 0;
      do {
        fVar24 = 0.0;
        if (0 < (int)uVar14) {
          uVar18 = 0;
          do {
            fVar24 = fVar24 + *(float *)((long)pvVar13 + uVar18 * 4);
            uVar18 = uVar18 + 1;
          } while (uVar14 != uVar18);
        }
        *(float *)((long)pvVar11 + lVar16 * 4) = fVar24;
        lVar16 = lVar16 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
      } while (lVar16 != lVar12);
      if (iVar1 < 1) goto LAB_00140b64;
      fVar24 = 0.0;
      lVar16 = 0;
      do {
        fVar24 = fVar24 + *(float *)((long)pvVar11 + lVar16 * 4);
        lVar16 = lVar16 + 1;
      } while (lVar12 != lVar16);
    }
    *(float *)b->data = fVar24;
    LOCK();
    piVar15 = (int *)((long)pvVar11 + uVar20);
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 != 0) {
      return 0;
    }
    if (pAVar6 != (Allocator *)0x0) {
      (**(code **)(*(long *)pAVar6 + 0x18))(pAVar6,pvVar11);
      return 0;
    }
    goto LAB_00140d21;
  }
  if (iVar1 != 2) {
    if (iVar1 == 1) {
      iVar1 = a->w;
      Mat::create(b,1,sVar2,opt->blob_allocator);
      if ((long)iVar1 < 1) {
        fVar24 = 0.0;
      }
      else {
        fVar24 = 0.0;
        lVar12 = 0;
        do {
          fVar24 = fVar24 + *(float *)((long)a->data + lVar12 * 4);
          lVar12 = lVar12 + 1;
        } while (iVar1 != lVar12);
      }
      *(float *)b->data = fVar24;
      return 0;
    }
    return 0;
  }
  uVar10 = a->w;
  uVar20 = (ulong)uVar10;
  iVar1 = a->h;
  lVar12 = (long)iVar1;
  if (!reduce_w || !reduce_h) {
    if (reduce_w && !reduce_h) {
      Mat::create(b,1,iVar1,sVar2,opt->blob_allocator);
      if (0 < iVar1) {
        pvVar11 = a->data;
        iVar1 = a->w;
        pvVar13 = b->data;
        sVar2 = a->elemsize;
        lVar16 = 0;
        do {
          fVar24 = 0.0;
          if (0 < (int)uVar10) {
            uVar18 = 0;
            do {
              fVar24 = fVar24 + *(float *)((long)pvVar11 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar20 != uVar18);
          }
          *(float *)((long)pvVar13 + lVar16 * 4) = fVar24;
          lVar16 = lVar16 + 1;
          pvVar11 = (void *)((long)pvVar11 + (long)iVar1 * sVar2);
        } while (lVar16 != lVar12);
        return 0;
      }
      return 0;
    }
    if (!reduce_h || reduce_w) {
      return 0;
    }
    Mat::create(b,uVar10,1,sVar2,opt->blob_allocator);
    uVar8 = b->c * (int)b->cstep;
    if (0 < (int)uVar8) {
      memset(b->data,0,(ulong)uVar8 << 2);
    }
    if (0 < iVar1) {
      pvVar11 = a->data;
      iVar1 = a->w;
      pvVar13 = b->data;
      sVar2 = a->elemsize;
      lVar16 = 0;
      do {
        if (0 < (int)uVar10) {
          uVar18 = 0;
          do {
            *(float *)((long)pvVar13 + uVar18 * 4) =
                 *(float *)((long)pvVar11 + uVar18 * 4) + *(float *)((long)pvVar13 + uVar18 * 4);
            uVar18 = uVar18 + 1;
          } while (uVar20 != uVar18);
        }
        lVar16 = lVar16 + 1;
        pvVar11 = (void *)((long)pvVar11 + (long)iVar1 * sVar2);
      } while (lVar16 != lVar12);
      return 0;
    }
    return 0;
  }
  Mat::create(b,1,1,sVar2,opt->blob_allocator);
  if (iVar1 == 0) {
    return -100;
  }
  pAVar6 = opt->workspace_allocator;
  piVar15 = (int *)(sVar2 * lVar12 + 3 & 0xfffffffffffffffc);
  if (pAVar6 == (Allocator *)0x0) {
    local_78.data = (void *)0x0;
    iVar9 = posix_memalign(&local_78.data,0x10,(size_t)(piVar15 + 1));
    pvVar11 = local_78.data;
    if (iVar9 != 0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      return -100;
    }
  }
  else {
    pvVar11 = (void *)(**(code **)(*(long *)pAVar6 + 0x10))();
  }
  *(undefined4 *)((long)pvVar11 + (long)piVar15) = 1;
  if (iVar1 < 1) {
LAB_001409d8:
    fVar24 = 0.0;
  }
  else {
    pvVar13 = a->data;
    iVar9 = a->w;
    sVar2 = a->elemsize;
    lVar16 = 0;
    do {
      fVar24 = 0.0;
      if (0 < (int)uVar10) {
        uVar18 = 0;
        do {
          fVar24 = fVar24 + *(float *)((long)pvVar13 + uVar18 * 4);
          uVar18 = uVar18 + 1;
        } while (uVar20 != uVar18);
      }
      *(float *)((long)pvVar11 + lVar16 * 4) = fVar24;
      lVar16 = lVar16 + 1;
      pvVar13 = (void *)((long)pvVar13 + (long)iVar9 * sVar2);
    } while (lVar16 != lVar12);
    if (iVar1 < 1) goto LAB_001409d8;
    fVar24 = 0.0;
    lVar16 = 0;
    do {
      fVar24 = fVar24 + *(float *)((long)pvVar11 + lVar16 * 4);
      lVar16 = lVar16 + 1;
    } while (lVar12 != lVar16);
  }
  *(float *)b->data = fVar24;
  LOCK();
  piVar15 = (int *)((long)pvVar11 + (long)piVar15);
  *piVar15 = *piVar15 + -1;
  UNLOCK();
  if (*piVar15 != 0) {
    return 0;
  }
  if (pAVar6 != (Allocator *)0x0) {
    (**(code **)(*(long *)pAVar6 + 0x18))(pAVar6,pvVar11);
    return 0;
  }
LAB_00140d21:
  free(pvVar11);
  return 0;
}

Assistant:

static int reduction_op_keepdims(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i=0; i<w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> 1 1
            b.create(1, 1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i=0; i<h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> 1 h
            b.create(1, h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }

            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w 1
            b.create(w, 1, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);
                for (int j=0; j<w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }

            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> 1 1 1
            b.create(1, 1, 1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i=0; i<channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> 1 1 c
            b.create(1, 1, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[0] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> 1 h c
            b.create(1, h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> 1 h 1
            b.create(1, h, 1, elemsize, opt.blob_allocator);

            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }
            
            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i=0; i<h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w 1 1
            b.create(w, 1, 1, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j=0; j<w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h 1
            b.create(w, h, 1, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i=0; i<size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w 1 c
            b.create(w, 1, channels, elemsize, opt.blob_allocator);
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            return 0;
        }
    }

    return 0;
}